

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall google::protobuf::FileOptions::FileOptions(FileOptions *this,FileOptions *from)

{
  void *pvVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  uint uVar9;
  
  (this->super_Message).super_MessageLite._vptr_MessageLite =
       (_func_int **)&PTR__FileOptions_00772540;
  internal::ExtensionSet::ExtensionSet(&this->_extensions_);
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
  .ptr_ = (void *)0x0;
  (this->_has_bits_).has_bits_[0] = (from->_has_bits_).has_bits_[0];
  this->_cached_size_ = 0;
  RepeatedPtrField<google::protobuf::UninterpretedOption>::RepeatedPtrField
            (&this->uninterpreted_option_,&from->uninterpreted_option_);
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadataWithArena::DoMergeFrom
              (&this->_internal_metadata_,(UnknownFieldSet *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  internal::ExtensionSet::MergeFrom(&this->_extensions_,&from->_extensions_);
  (this->java_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  uVar9 = (from->_has_bits_).has_bits_[0];
  if ((uVar9 & 1) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->java_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->java_package_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->java_outer_classname_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 2) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->java_outer_classname_,
               (string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->java_outer_classname_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->go_package_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 4) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->go_package_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->go_package_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->objc_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 8) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->objc_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->objc_class_prefix_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->csharp_namespace_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 0x10) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->csharp_namespace_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->csharp_namespace_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->swift_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 0x20) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->swift_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->swift_prefix_).ptr_);
    uVar9 = (from->_has_bits_).has_bits_[0];
  }
  (this->php_class_prefix_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  if ((uVar9 & 0x40) != 0) {
    internal::ArenaStringPtr::AssignWithDefault
              (&this->php_class_prefix_,(string *)&internal::fixed_address_empty_string_abi_cxx11_,
               (from->php_class_prefix_).ptr_);
  }
  this->optimize_for_ = from->optimize_for_;
  bVar2 = from->java_generate_equals_and_hash_;
  bVar3 = from->java_string_check_utf8_;
  bVar4 = from->cc_generic_services_;
  bVar5 = from->java_generic_services_;
  bVar6 = from->py_generic_services_;
  bVar7 = from->deprecated_;
  bVar8 = from->cc_enable_arenas_;
  this->java_multiple_files_ = from->java_multiple_files_;
  this->java_generate_equals_and_hash_ = bVar2;
  this->java_string_check_utf8_ = bVar3;
  this->cc_generic_services_ = bVar4;
  this->java_generic_services_ = bVar5;
  this->py_generic_services_ = bVar6;
  this->deprecated_ = bVar7;
  this->cc_enable_arenas_ = bVar8;
  return;
}

Assistant:

FileOptions::FileOptions(const FileOptions& from)
  : ::google::protobuf::Message(),
      _internal_metadata_(NULL),
      _has_bits_(from._has_bits_),
      _cached_size_(0),
      uninterpreted_option_(from.uninterpreted_option_) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  _extensions_.MergeFrom(from._extensions_);
  java_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_java_package()) {
    java_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_package_);
  }
  java_outer_classname_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_java_outer_classname()) {
    java_outer_classname_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.java_outer_classname_);
  }
  go_package_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_go_package()) {
    go_package_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.go_package_);
  }
  objc_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_objc_class_prefix()) {
    objc_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.objc_class_prefix_);
  }
  csharp_namespace_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_csharp_namespace()) {
    csharp_namespace_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.csharp_namespace_);
  }
  swift_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_swift_prefix()) {
    swift_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.swift_prefix_);
  }
  php_class_prefix_.UnsafeSetDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited());
  if (from.has_php_class_prefix()) {
    php_class_prefix_.AssignWithDefault(&::google::protobuf::internal::GetEmptyStringAlreadyInited(), from.php_class_prefix_);
  }
  ::memcpy(&java_multiple_files_, &from.java_multiple_files_,
    reinterpret_cast<char*>(&optimize_for_) -
    reinterpret_cast<char*>(&java_multiple_files_) + sizeof(optimize_for_));
  // @@protoc_insertion_point(copy_constructor:google.protobuf.FileOptions)
}